

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(void)

{
  testSimplePackets();
  testDifferentPacketConfigWorks();
  testSerializationAPIsWork();
  testPacketPartsWorks();
  testInvalidPacketAreDetected();
  return 0;
}

Assistant:

int
main(void)
{
    testPacketLengthCalculation();
    testSimplePackets();
    testDifferentPacketConfigWorks();
    testSerializationAPIsWork();
    testPacketLimits();
    testPacketPartsWorks();
    testInvalidPacketAreDetected();
    return 0;
}